

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perlin.h
# Opt level: O3

void __thiscall perlin::perlin(perlin *this)

{
  int *piVar1;
  double *pdVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  double local_38;
  double dStack_30;
  double local_28;
  
  memset(this,0,0x1800);
  lVar3 = 0x10;
  do {
    vec3::random();
    dVar8 = 1.0 / SQRT(local_28 * local_28 + local_38 * local_38 + dStack_30 * dStack_30);
    pdVar2 = (double *)((long)this->randvec[0].e + lVar3 + -0x10);
    *pdVar2 = dVar8 * local_38;
    pdVar2[1] = dVar8 * dStack_30;
    *(double *)((long)this->randvec[0].e + lVar3) = local_28 * dVar8;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x1810);
  iVar4 = 0;
  iVar5 = 1;
  iVar6 = 2;
  iVar7 = 3;
  lVar3 = 0;
  do {
    piVar1 = this->perm_x + lVar3;
    *piVar1 = iVar4;
    piVar1[1] = iVar5;
    piVar1[2] = iVar6;
    piVar1[3] = iVar7;
    lVar3 = lVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar6 = iVar6 + 4;
    iVar7 = iVar7 + 4;
  } while (lVar3 != 0x100);
  permute(this->perm_x,0x100);
  iVar4 = 0;
  iVar5 = 1;
  iVar6 = 2;
  iVar7 = 3;
  lVar3 = 0;
  do {
    piVar1 = this->perm_y + lVar3;
    *piVar1 = iVar4;
    piVar1[1] = iVar5;
    piVar1[2] = iVar6;
    piVar1[3] = iVar7;
    lVar3 = lVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar6 = iVar6 + 4;
    iVar7 = iVar7 + 4;
  } while (lVar3 != 0x100);
  permute(this->perm_y,0x100);
  iVar4 = 0;
  iVar5 = 1;
  iVar6 = 2;
  iVar7 = 3;
  lVar3 = 0;
  do {
    piVar1 = this->perm_z + lVar3;
    *piVar1 = iVar4;
    piVar1[1] = iVar5;
    piVar1[2] = iVar6;
    piVar1[3] = iVar7;
    lVar3 = lVar3 + 4;
    iVar4 = iVar4 + 4;
    iVar5 = iVar5 + 4;
    iVar6 = iVar6 + 4;
    iVar7 = iVar7 + 4;
  } while (lVar3 != 0x100);
  permute(this->perm_z,0x100);
  return;
}

Assistant:

perlin() {
        for (int i = 0; i < point_count; i++) {
            randvec[i] = unit_vector(vec3::random(-1,1));
        }

        perlin_generate_perm(perm_x);
        perlin_generate_perm(perm_y);
        perlin_generate_perm(perm_z);
    }